

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Flush(TableBuilder *this)

{
  bool bVar1;
  Status local_20;
  Rep *local_18;
  Rep *r;
  TableBuilder *this_local;
  
  local_18 = this->rep_;
  r = (Rep *)this;
  if (((local_18->closed ^ 0xffU) & 1) == 0) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                  ,0x7f,"void leveldb::TableBuilder::Flush()");
  }
  bVar1 = ok(this);
  if ((bVar1) && (bVar1 = BlockBuilder::empty(&local_18->data_block), !bVar1)) {
    if (((local_18->pending_index_entry ^ 0xffU) & 1) == 0) {
      __assert_fail("!r->pending_index_entry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                    ,0x82,"void leveldb::TableBuilder::Flush()");
    }
    WriteBlock(this,&local_18->data_block,&local_18->pending_handle);
    bVar1 = ok(this);
    if (bVar1) {
      local_18->pending_index_entry = true;
      (*local_18->file->_vptr_WritableFile[4])(&local_20);
      Status::operator=(&local_18->status,&local_20);
      Status::~Status(&local_20);
    }
    if (local_18->filter_block != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::StartBlock(local_18->filter_block,local_18->offset);
    }
  }
  return;
}

Assistant:

void TableBuilder::Flush() {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->data_block.empty()) return;
  assert(!r->pending_index_entry);
  WriteBlock(&r->data_block, &r->pending_handle);
  if (ok()) {
    r->pending_index_entry = true;
    r->status = r->file->Flush();
  }
  if (r->filter_block != nullptr) {
    r->filter_block->StartBlock(r->offset);
  }
}